

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  char c;
  archive_string *paVar1;
  size_t sVar2;
  wchar_t wVar3;
  char *p;
  wchar_t local_3c;
  mbstate_t_conflict shift_state;
  
  if (sc->same == L'\0') {
    wVar3 = L'\0';
    while (length != 0) {
      c = *_p;
      if (c == '\0') {
        return wVar3;
      }
      if (c < '\0') {
        c = '?';
        wVar3 = L'\xffffffff';
        if ((sc->flag & L'Ā') == L'\0') goto LAB_005dc978;
        paVar1 = archive_string_append(as,utf8_replacement_char,3);
        wVar3 = L'\xffffffff';
        if (paVar1 == (archive_string *)0x0) {
          __archive_errx(1,"Out of memory");
        }
      }
      else {
LAB_005dc978:
        archive_strappend_char(as,c);
      }
      _p = (void *)((long)_p + 1);
    }
  }
  else {
    paVar1 = archive_string_append(as,(char *)_p,length);
    if (paVar1 == (archive_string *)0x0) {
LAB_005dc9b1:
      wVar3 = L'\xffffffff';
    }
    else {
      shift_state.__count = L'\0';
      shift_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
      wVar3 = L'\0';
      for (; length != 0; length = length - sVar2) {
        sVar2 = mbrtowc(&local_3c,(char *)_p,length,(mbstate_t *)&shift_state);
        if (0xfffffffffffffffd < sVar2) goto LAB_005dc9b1;
        if (sVar2 == 0) {
          return L'\0';
        }
        _p = (void *)((long)_p + sVar2);
      }
    }
  }
  return wVar3;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	const uint8_t *itp;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' character instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */

	remaining = length;
	itp = (const uint8_t *)_p;
	while (*itp && remaining > 0) {
		if (*itp > 127) {
			// Non-ASCII: Substitute with suitable replacement
			if (sc->flag & SCONV_TO_UTF8) {
				if (archive_string_append(as, utf8_replacement_char, sizeof(utf8_replacement_char)) == NULL) {
					__archive_errx(1, "Out of memory");
				}
			} else {
				archive_strappend_char(as, '?');
			}
			return_value = -1;
		} else {
			archive_strappend_char(as, *itp);
		}
		++itp;
	}
	return (return_value);
}